

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSGlue::emitPre(Wasm2JSGlue *this)

{
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> _Var1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if ((this->flags).emscripten == true) {
    emitPreEmscripten(this);
  }
  else {
    emitPreES6(this);
  }
  bVar2 = isTableExported(this->wasm);
  if (bVar2) {
    std::operator<<(&this->out->out,"function Table(ret) {\n");
    _Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
         (((this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>;
    poVar3 = &this->out->out;
    if (*(long *)((long)_Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x38) ==
        *(long *)((long)_Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40)) {
      pcVar4 = "  // grow method not included; table is not growable\n";
    }
    else {
      poVar3 = std::operator<<(poVar3,"  ret.grow = function(by) {\n");
      poVar3 = std::operator<<(poVar3,"    var old = this.length;\n");
      poVar3 = std::operator<<(poVar3,"    this.length = this.length + by;\n");
      poVar3 = std::operator<<(poVar3,"    return old;\n");
      pcVar4 = "  };\n";
    }
    std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(&this->out->out,"  ret.set = function(i, func) {\n");
    poVar3 = std::operator<<(poVar3,"    this[i] = func;\n");
    poVar3 = std::operator<<(poVar3,"  };\n");
    poVar3 = std::operator<<(poVar3,"  ret.get = function(i) {\n");
    poVar3 = std::operator<<(poVar3,"    return this[i];\n");
    poVar3 = std::operator<<(poVar3,"  };\n");
    poVar3 = std::operator<<(poVar3,"  return ret;\n");
    std::operator<<(poVar3,"}\n\n");
  }
  emitMemory(this);
  emitSpecialSupport(this);
  return;
}

Assistant:

void Wasm2JSGlue::emitPre() {
  if (flags.emscripten) {
    emitPreEmscripten();
  } else {
    emitPreES6();
  }

  if (isTableExported(wasm)) {
    out << "function Table(ret) {\n";
    if (wasm.tables[0]->initial == wasm.tables[0]->max) {
      out << "  // grow method not included; table is not growable\n";
    } else {
      out << "  ret.grow = function(by) {\n"
          << "    var old = this.length;\n"
          << "    this.length = this.length + by;\n"
          << "    return old;\n"
          << "  };\n";
    }
    out << "  ret.set = function(i, func) {\n"
        << "    this[i] = func;\n"
        << "  };\n"
        << "  ret.get = function(i) {\n"
        << "    return this[i];\n"
        << "  };\n"
        << "  return ret;\n"
        << "}\n\n";
  }

  emitMemory();
  emitSpecialSupport();
}